

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.h
# Opt level: O0

void __thiscall ModuleData::ModuleData(ModuleData *this,SynBase *source,InplaceStr name)

{
  SynBase *source_local;
  ModuleData *this_local;
  InplaceStr name_local;
  
  this->source = source;
  (this->name).begin = name.begin;
  (this->name).end = name.end;
  this->importIndex = 0;
  this->bytecode = (ByteCode *)0x0;
  this->lexer = (Lexer *)0x0;
  this->lexStream = (Lexeme *)0x0;
  this->lexStreamSize = 0;
  this->startingFunctionIndex = 0;
  this->importedFunctionCount = 0;
  this->moduleFunctionCount = 0;
  return;
}

Assistant:

ModuleData(SynBase *source, InplaceStr name): source(source), name(name)
	{
		importIndex = 0;

		bytecode = NULL;

		lexer = NULL;
		lexStream = NULL;
		lexStreamSize = 0;

		startingFunctionIndex = 0;
		importedFunctionCount = 0;
		moduleFunctionCount = 0;
	}